

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h263d_vdpu2.c
# Opt level: O0

MPP_RET hal_vpu2_h263d_gen_regs(void *hal,HalTaskInfo *syn)

{
  void *__s;
  int iVar1;
  MppSyntax syntax;
  RK_U32 local_54;
  Vpu2H263dRegSet_t *regs;
  MppBuffer buf_pkt;
  MppBuffer buf_frm_ref0;
  MppBuffer buf_frm_curr;
  HalDecTask *task;
  hal_h263_ctx *ctx;
  HalTaskInfo *pHStack_18;
  MPP_RET ret;
  HalTaskInfo *syn_local;
  void *hal_local;
  
  ctx._4_4_ = MPP_OK;
  buf_frm_ref0 = (MppBuffer)0x0;
  buf_pkt = (MppBuffer)0x0;
  regs = (Vpu2H263dRegSet_t *)0x0;
  __s = *(void **)((long)hal + 0x88);
  buf_frm_curr = syn;
  task = (HalDecTask *)hal;
  pHStack_18 = syn;
  syn_local = (HalTaskInfo *)hal;
  if (((syn->dec).valid == 0) &&
     (_mpp_log_l(2,"hal_vpu_h263d","Assertion %s failed at %s:%d\n",(char *)0x0,"task->valid",
                 "hal_vpu2_h263d_gen_regs",0xbe), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((*(int *)((long)buf_frm_curr + 0x2c) < 0) &&
     (_mpp_log_l(2,"hal_vpu_h263d","Assertion %s failed at %s:%d\n",(char *)0x0,"task->input >= 0",
                 "hal_vpu2_h263d_gen_regs",0xbf), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((*(int *)((long)buf_frm_curr + 0x34) < 0) &&
     (_mpp_log_l(2,"hal_vpu_h263d","Assertion %s failed at %s:%d\n",(char *)0x0,"task->output >= 0",
                 "hal_vpu2_h263d_gen_regs",0xc0), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  memset(__s,0,0x27c);
  *(uint *)((long)__s + 0xd8) = *(uint *)((long)__s + 0xd8) & 0xfffffffd | 2;
  *(uint *)((long)__s + 0xd8) = *(uint *)((long)__s + 0xd8) & 0xfffffffe | 1;
  *(uint *)((long)__s + 0xd8) = *(uint *)((long)__s + 0xd8) & 0xfffffffb | 4;
  *(uint *)((long)__s + 0xd8) = *(uint *)((long)__s + 0xd8) & 0xfffffff7 | 8;
  *(uint *)((long)__s + 0xd8) = *(uint *)((long)__s + 0xd8) & 0xffffffef | 0x10;
  *(uint *)((long)__s + 0xd8) = *(uint *)((long)__s + 0xd8) & 0xffffffdf | 0x20;
  *(uint *)((long)__s + 0xe0) = *(uint *)((long)__s + 0xe0) & 0xffe0ffff | 0x100000;
  *(uint *)((long)__s + 0xd0) = *(uint *)((long)__s + 0xd0) & 0x8001ffff | 0x20000;
  *(uint *)((long)__s + 0xe4) = *(uint *)((long)__s + 0xe4) & 0xffffffdf | 0x20;
  *(uint *)((long)__s + 0xe4) = *(uint *)((long)__s + 0xe4) & 0xffffffef | 0x10;
  *(uint *)((long)__s + 0xe4) = *(uint *)((long)__s + 0xe4) & 0xfffffffe | 1;
  *(uint *)((long)__s + 0xec) = *(uint *)((long)__s + 0xec) & 0x3fffff | 0xffc00000;
  *(uint *)((long)__s + 0xec) = *(uint *)((long)__s + 0xec) & 0xffc00fff | 0x3000;
  *(uint *)((long)__s + 0xec) = *(uint *)((long)__s + 0xec) & 0xfffff003 | 0xfe8;
  *(uint *)((long)__s + 0x264) = *(uint *)((long)__s + 0x264) & 0x3fffff | 0x5000000;
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)(task->refer + 10),*(RK_S32 *)((long)buf_frm_curr + 0x2c),SLOT_BUFFER,
             &regs);
  if ((regs == (Vpu2H263dRegSet_t *)0x0) &&
     (_mpp_log_l(2,"hal_vpu_h263d","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_pkt",
                 "hal_vpu2_h263d_gen_regs",0xd9), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  vpu_h263d_get_buffer_by_index
            ((hal_h263_ctx *)task,*(RK_S32 *)((long)buf_frm_curr + 0x34),&buf_frm_ref0);
  vpu_h263d_get_buffer_by_index
            ((hal_h263_ctx *)task,*(RK_S32 *)((long)buf_frm_curr + 0x38),&buf_pkt);
  iVar1 = mpp_buffer_get_fd_with_caller(buf_frm_ref0,"hal_vpu2_h263d_gen_regs");
  *(int *)&task->field_0x7c = iVar1;
  if (buf_pkt == (MppBuffer)0x0) {
    local_54 = 0xffffffff;
  }
  else {
    local_54 = mpp_buffer_get_fd_with_caller(buf_pkt,"hal_vpu2_h263d_gen_regs");
  }
  task[1].valid = local_54;
  *(undefined4 *)((long)__s + 0xfc) = *(undefined4 *)&task->field_0x7c;
  iVar1 = mpp_buffer_get_fd_with_caller(regs,"hal_vpu2_h263d_gen_regs");
  *(int *)((long)__s + 0x100) = iVar1;
  syntax._4_4_ = 0;
  syntax.number = *(uint *)((long)buf_frm_curr + 0x10);
  syntax.data = *(void **)((long)buf_frm_curr + 0x18);
  vpu2_h263d_setup_regs_by_syntax((hal_h263_ctx *)task,syntax);
  return ctx._4_4_;
}

Assistant:

MPP_RET hal_vpu2_h263d_gen_regs(void *hal,  HalTaskInfo *syn)
{
    MPP_RET ret = MPP_OK;
    hal_h263_ctx *ctx = (hal_h263_ctx *)hal;
    HalDecTask *task = &syn->dec;
    MppBuffer buf_frm_curr = NULL;
    MppBuffer buf_frm_ref0 = NULL;
    MppBuffer buf_pkt = NULL;
    Vpu2H263dRegSet_t *regs = (Vpu2H263dRegSet_t*)ctx->regs;

    mpp_assert(task->valid);
    mpp_assert(task->input >= 0);
    mpp_assert(task->output >= 0);

    memset(regs, 0, sizeof(Vpu2H263dRegSet_t));

    /*
     * basic register configuration setup here
     */
    regs->reg54_endian.sw_dec_out_endian = 1;
    regs->reg54_endian.sw_dec_in_endian = 1;
    regs->reg54_endian.sw_dec_inswap32_e = 1;
    regs->reg54_endian.sw_dec_outswap32_e = 1;
    regs->reg54_endian.sw_dec_strswap32_e = 1;
    regs->reg54_endian.sw_dec_strendian_e = 1;
    regs->reg56_axi_ctrl.sw_dec_max_burst = 16;
    regs->reg52_error_concealment.sw_apf_threshold = 1;
    regs->reg57_enable_ctrl.sw_dec_timeout_e = 1;
    regs->reg57_enable_ctrl.sw_dec_clk_gate_e = 1;
    regs->reg57_enable_ctrl.sw_dec_e = 1;
    regs->reg59.sw_pred_bc_tap_0_0 = -1;
    regs->reg59.sw_pred_bc_tap_0_1 = 3;
    regs->reg59.sw_pred_bc_tap_0_2 = -6;
    regs->reg153.sw_pred_bc_tap_0_3 = 20;

    /* setup buffer for input / output / reference */
    mpp_buf_slot_get_prop(ctx->pkt_slots, task->input, SLOT_BUFFER, &buf_pkt);
    mpp_assert(buf_pkt);
    vpu_h263d_get_buffer_by_index(ctx, task->output, &buf_frm_curr);
    vpu_h263d_get_buffer_by_index(ctx, task->refer[0], &buf_frm_ref0);

    /* address registers setup first */
    ctx->fd_curr = mpp_buffer_get_fd(buf_frm_curr);
    ctx->fd_ref0 = (buf_frm_ref0) ? (mpp_buffer_get_fd(buf_frm_ref0)) : (-1);
    regs->reg63_cur_pic_base = (RK_U32)ctx->fd_curr;
    regs->reg64_input_stream_base = mpp_buffer_get_fd(buf_pkt);

    /* setup other registers, here will update packet address */
    vpu2_h263d_setup_regs_by_syntax(ctx, task->syntax);

    return ret;
}